

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_point_times_order(void)

{
  int iVar1;
  secp256k1_gej j;
  secp256k1_ge p;
  secp256k1_fe x;
  int i;
  secp256k1_ge *in_stack_fffffffffffffef8;
  secp256k1_gej *in_stack_ffffffffffffff00;
  secp256k1_fe *in_stack_ffffffffffffff18;
  secp256k1_fe *in_stack_ffffffffffffff20;
  secp256k1_ge *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  secp256k1_fe *in_stack_ffffffffffffff58;
  secp256k1_ge *in_stack_ffffffffffffff60;
  secp256k1_fe local_30;
  int local_4;
  
  memset(&local_30,0,0x28);
  local_30.n[0] = 2;
  local_4 = 0;
  do {
    if (499 < local_4) {
      secp256k1_fe_impl_normalize_var(&local_30);
      iVar1 = secp256k1_fe_equal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x111b,"test condition failed: secp256k1_fe_equal(&x, &xr)");
        abort();
      }
      return;
    }
    iVar1 = secp256k1_ge_set_xo_var
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54
                      );
    if (iVar1 != 0) {
      iVar1 = secp256k1_ge_is_valid_var(in_stack_ffffffffffffff48);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1114,"test condition failed: secp256k1_ge_is_valid_var(&p)");
        abort();
      }
      secp256k1_gej_set_ge(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      test_point_times_order((secp256k1_gej *)x.n[1]);
    }
    secp256k1_fe_impl_sqr(&in_stack_ffffffffffffff00->x,&in_stack_fffffffffffffef8->x);
    local_4 = local_4 + 1;
  } while( true );
}

Assistant:

static void run_point_times_order(void) {
    int i;
    secp256k1_fe x = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 2);
    static const secp256k1_fe xr = SECP256K1_FE_CONST(
        0x7603CB59, 0xB0EF6C63, 0xFE608479, 0x2A0C378C,
        0xDB3233A8, 0x0F8A9A09, 0xA877DEAD, 0x31B38C45
    );
    for (i = 0; i < 500; i++) {
        secp256k1_ge p;
        if (secp256k1_ge_set_xo_var(&p, &x, 1)) {
            secp256k1_gej j;
            CHECK(secp256k1_ge_is_valid_var(&p));
            secp256k1_gej_set_ge(&j, &p);
            test_point_times_order(&j);
        }
        secp256k1_fe_sqr(&x, &x);
    }
    secp256k1_fe_normalize_var(&x);
    CHECK(secp256k1_fe_equal(&x, &xr));
}